

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

double __thiscall smf::MidiFile::getFileDurationInSeconds(MidiFile *this)

{
  int iVar1;
  pointer ppMVar2;
  MidiEvent *pMVar3;
  int i;
  long lVar4;
  double local_20;
  
  if ((this->m_timemapvalid == false) && (buildTimeMap(this), this->m_timemapvalid == false)) {
    return -1.0;
  }
  iVar1 = this->m_theTimeState;
  if (iVar1 == 0) {
    makeAbsoluteTicks(this);
  }
  local_20 = 0.0;
  for (lVar4 = 0;
      ppMVar2 = (this->m_events).
                super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      lVar4 < (int)((ulong)((long)(this->m_events).
                                  super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar2) >> 3);
      lVar4 = lVar4 + 1) {
    pMVar3 = MidiEventList::back(ppMVar2[lVar4]);
    if (local_20 < (double)pMVar3->tick) {
      pMVar3 = MidiEventList::back((this->m_events).
                                   super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar4]);
      local_20 = pMVar3->seconds;
    }
  }
  if (iVar1 == 0) {
    makeDeltaTicks(this);
  }
  return local_20;
}

Assistant:

double MidiFile::getFileDurationInSeconds(void) {
	if (m_timemapvalid == 0) {
		buildTimeMap();
		if (m_timemapvalid == 0) {
			return -1.0;    // something went wrong
		}
	}
	bool revertToDelta = false;
	if (isDeltaTicks()) {
		makeAbsoluteTicks();
		revertToDelta = true;
	}
	const MidiFile& mf = *this;
	double output = 0.0;
	for (int i=0; i<mf.getTrackCount(); i++) {
		if (mf[i].back().tick > output) {
			output = mf[i].back().seconds;
		}
	}
	if (revertToDelta) {
		deltaTicks();
	}
	return output;
}